

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

ssize_t amqp_ssl_socket_recv(void *base,void *buf,size_t len,int flags)

{
  int iVar1;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  ssize_t received;
  amqp_ssl_socket_t *self;
  undefined8 local_30;
  
  ERR_clear_error();
  *(undefined4 *)(in_RDI + 0x34) = 0;
  iVar1 = SSL_read(*(SSL **)(in_RDI + 0x18),in_RSI,in_EDX);
  local_30 = (long)iVar1;
  if (local_30 < 1) {
    iVar1 = SSL_get_error(*(SSL **)(in_RDI + 0x18),iVar1);
    *(int *)(in_RDI + 0x34) = iVar1;
    if (*(int *)(in_RDI + 0x34) == 6) {
      local_30 = -7;
    }
    else {
      local_30 = -0x200;
    }
  }
  return local_30;
}

Assistant:

static ssize_t
amqp_ssl_socket_recv(void *base,
                     void *buf,
                     size_t len,
                     AMQP_UNUSED int flags)
{
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  ssize_t received;
  ERR_clear_error();
  self->internal_error = 0;

  received = SSL_read(self->ssl, buf, len);
  if (0 >= received) {
    self->internal_error = SSL_get_error(self->ssl, received);
    switch(self->internal_error) {
    case SSL_ERROR_ZERO_RETURN:
      received = AMQP_STATUS_CONNECTION_CLOSED;
      break;
    default:
      received = AMQP_STATUS_SSL_ERROR;
      break;
    }
  }

  return received;
}